

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  ModuleFieldType MVar1;
  Errors *errors;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  TokenTypePair pair;
  reference pMVar5;
  __node_base *p_Var6;
  Func *func;
  _func_int **pp_Var7;
  FuncDeclaration *decl;
  ImportModuleField *import_field;
  iterator rhs;
  iterator __begin2;
  ResolveFuncTypesExprVisitorDelegate delegate;
  ExprVisitor local_80;
  
  while( true ) {
    pair = PeekPair(this);
    bVar2 = anon_unknown_1::IsModuleField(pair);
    if (!bVar2) break;
    RVar4 = ParseModuleField(this,module);
    if ((RVar4.enum_ == Error) &&
       (RVar4 = Synchronize(this,anon_unknown_1::IsModuleField), RVar4.enum_ == Error)) {
      return (Result)Error;
    }
  }
  errors = this->errors_;
  __begin2.node_ = (module->fields).first_;
  bVar2 = false;
  __begin2.list_ = &module->fields;
  do {
    rhs.node_ = (ModuleField *)0x0;
    rhs.list_ = &module->fields;
    bVar3 = intrusive_list<wabt::ModuleField>::iterator::operator!=(&__begin2,rhs);
    if (!bVar3) {
      if (bVar2) {
        return (Result)Error;
      }
      RVar4 = ResolveNamesModule(module,this->errors_);
      return (Result)(uint)(RVar4.enum_ == Error);
    }
    pMVar5 = intrusive_list<wabt::ModuleField>::iterator::operator*(&__begin2);
    MVar1 = pMVar5->type_;
    if (MVar1 == Event) {
      decl = (FuncDeclaration *)&pMVar5[1].loc.filename.size_;
LAB_0016ade6:
      func = (Func *)0x0;
LAB_0016ade8:
      bVar3 = anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
      anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar5->loc,module,decl);
      RVar4 = anon_unknown_1::CheckFuncTypeVarMatchesExplicit(&pMVar5->loc,module,decl,errors);
      bVar2 = RVar4.enum_ == Error || bVar2;
      if (func != (Func *)0x0) {
        if (bVar3) {
          p_Var6 = &(func->bindings).
                    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                    ._M_h._M_before_begin;
          while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
            *(int *)&p_Var6[9]._M_nxt =
                 *(int *)&p_Var6[9]._M_nxt +
                 (int)((ulong)((long)(func->decl).sig.param_types.
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(func->decl).sig.param_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
          }
        }
        delegate.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__Delegate_001c3838
        ;
        delegate.module_ = module;
        delegate.errors_ = errors;
        ExprVisitor::ExprVisitor(&local_80,(Delegate *)&delegate);
        RVar4 = ExprVisitor::VisitFunc(&local_80,func);
        bVar2 = bVar2 || RVar4.enum_ == Error;
        ExprVisitor::~ExprVisitor(&local_80);
      }
    }
    else {
      if (MVar1 == Import) {
        pp_Var7 = pMVar5[1]._vptr_ModuleField;
        if (pp_Var7 == (_func_int **)0x0 || *(int *)(pp_Var7 + 9) != 0) {
          if (*(int *)(pp_Var7 + 9) != 4) {
            pp_Var7 = (_func_int **)0x0;
          }
          if (pp_Var7 == (_func_int **)0x0) goto LAB_0016aead;
        }
        decl = (FuncDeclaration *)(pp_Var7 + 0xe);
        goto LAB_0016ade6;
      }
      if (MVar1 == Func) {
        func = (Func *)(pMVar5 + 1);
        decl = (FuncDeclaration *)&pMVar5[1].loc.filename.size_;
        goto LAB_0016ade8;
      }
    }
LAB_0016aead:
    intrusive_list<wabt::ModuleField>::iterator::operator++(&__begin2);
  } while( true );
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);
  while (IsModuleField(PeekPair())) {
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  return Result::Ok;
}